

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getSum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  int iVar1;
  pointer ptVar2;
  TestError *this_00;
  InitializerListTest *pIVar3;
  string sStack_38;
  
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(ptVar2[iVar1].m_initializer) {
  case VECTOR:
    getVectorSum_abi_cxx11_(&sStack_38,this,"variable",ptVar2[iVar1].m_n_rows);
    goto LAB_00a73453;
  case MATRIX:
  case MATRIX_ROWS:
    getVectorArraySum_abi_cxx11_
              (&sStack_38,this,"variable[INDEX]",ptVar2[iVar1].m_n_cols,ptVar2[iVar1].m_n_rows);
    goto LAB_00a73453;
  case STRUCT:
    getVectorSum_abi_cxx11_(&sStack_38,this,"variable.member_a",ptVar2[iVar1].m_n_rows);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_b",ptVar2[iVar1].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case UNSIZED_ARRAY_VECTOR:
    getVectorArraySum_abi_cxx11_(&sStack_38,this,"variable[INDEX]",4,ptVar2[iVar1].m_n_rows);
LAB_00a73453:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    break;
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_MATRIX:
    getVectorArraySum_abi_cxx11_
              (&sStack_38,this,"variable[0][INDEX]",ptVar2[iVar1].m_n_cols,ptVar2[iVar1].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&sStack_38,pIVar3,"variable[1][INDEX]",ptVar2[iVar1].m_n_cols,ptVar2[iVar1].m_n_rows)
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&sStack_38,pIVar3,"variable[2][INDEX]",ptVar2[iVar1].m_n_cols,ptVar2[iVar1].m_n_rows)
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&sStack_38,pIVar3,"variable[3][INDEX]",ptVar2[iVar1].m_n_cols,ptVar2[iVar1].m_n_rows)
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    getVectorArraySum_abi_cxx11_
              (&sStack_38,this,"variable[INDEX].member_a",4,ptVar2[iVar1].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&sStack_38,pIVar3,"variable[INDEX].member_b",4,ptVar2[iVar1].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
    getVectorSum_abi_cxx11_(&sStack_38,this,"variable.member_a.member_a",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_a.member_b",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_b",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    getVectorSum_abi_cxx11_(&sStack_38,this,"variable.member_a",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_b[INDEX].member_a",3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_b[INDEX].member_b",3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    getVectorArraySum_abi_cxx11_(&sStack_38,this,"variable[INDEX].member_a.member_a",4,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&sStack_38,pIVar3,"variable[INDEX].member_a.member_b",4,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&sStack_38,pIVar3,"variable[INDEX].member_b",4,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    getVectorSum_abi_cxx11_(&sStack_38,this,"variable.member_a.member_a",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_a.member_b[INDEX]",2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    pIVar3 = (InitializerListTest *)0x18360bd;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&sStack_38,pIVar3,"variable.member_b",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x37e8);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getSum()
{
	static const GLchar* var = "variable";

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string sum;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		sum = getVectorSum(var, test_case.m_n_rows);

		break;

	case MATRIX:
	case MATRIX_ROWS:
		sum = getVectorArraySum("variable[INDEX]", test_case.m_n_cols, test_case.m_n_rows);

		break;

	case STRUCT:
		sum = getVectorSum("variable.member_a", test_case.m_n_rows);
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_b", test_case.m_n_rows));

		break;

	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		sum = "variable[0] + variable[1] + variable[2] + variable[3]";

		break;

	case ARRAY_VECTOR_LIST:
	case ARRAY_VECTOR_CTR:
	case UNSIZED_ARRAY_VECTOR:
		sum = getVectorArraySum("variable[INDEX]", 4 /* columns */, test_case.m_n_rows);

		break;

	case ARRAY_MATRIX_LIST:
	case ARRAY_MATRIX_CTR:
	case UNSIZED_ARRAY_MATRIX:
		sum.append(getVectorArraySum("variable[0][INDEX]", test_case.m_n_cols, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[1][INDEX]", test_case.m_n_cols, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[2][INDEX]", test_case.m_n_cols, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[3][INDEX]", test_case.m_n_cols, test_case.m_n_rows));

		break;

	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		sum.append(getVectorArraySum("variable[INDEX].member_a", 4, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[INDEX].member_b", 4, test_case.m_n_rows));

		break;

	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
		sum.append(getVectorSum("variable.member_a.member_a", 4));
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_a.member_b", 4));
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_b", 4));

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		sum.append(getVectorSum("variable.member_a", 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable.member_b[INDEX].member_a", 3, 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable.member_b[INDEX].member_b", 3, 4));

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		sum.append(getVectorArraySum("variable[INDEX].member_a.member_a", 4, 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[INDEX].member_a.member_b", 4, 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[INDEX].member_b", 4, 4));

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		sum.append(getVectorSum("variable.member_a.member_a", 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable.member_a.member_b[INDEX]", 2, 4));
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_b", 4));

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return sum;
}